

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O2

RPCHelpMan * wallet::gettransaction(void)

{
  vector<RPCResult,_std::allocator<RPCResult>_> v1;
  vector<RPCResult,_std::allocator<RPCResult>_> v1_00;
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_18;
  string description_19;
  string description_20;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffe518;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffe51c;
  undefined1 in_stack_ffffffffffffe520 [16];
  undefined8 in_stack_ffffffffffffe530;
  undefined8 in_stack_ffffffffffffe538;
  undefined8 in_stack_ffffffffffffe540;
  _Manager_type in_stack_ffffffffffffe548;
  undefined8 in_stack_ffffffffffffe550;
  undefined1 in_stack_ffffffffffffe558 [16];
  pointer in_stack_ffffffffffffe568;
  pointer pRVar10;
  pointer in_stack_ffffffffffffe570;
  pointer pRVar11;
  pointer in_stack_ffffffffffffe578;
  pointer pRVar12;
  pointer in_stack_ffffffffffffe580;
  undefined1 in_stack_ffffffffffffe588 [16];
  pointer in_stack_ffffffffffffe598;
  undefined8 in_stack_ffffffffffffe5a0;
  pointer in_stack_ffffffffffffe5a8;
  pointer pRVar13;
  pointer in_stack_ffffffffffffe5b0;
  pointer pRVar14;
  pointer in_stack_ffffffffffffe5b8;
  pointer pRVar15;
  _Invoker_type in_stack_ffffffffffffe5c0;
  pointer in_stack_ffffffffffffe5c8;
  pointer in_stack_ffffffffffffe5d0;
  pointer in_stack_ffffffffffffe5d8;
  undefined1 in_stack_ffffffffffffe5e0 [32];
  allocator<char> local_19fa;
  allocator<char> local_19f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19f8;
  allocator<char> local_19da;
  allocator<char> local_19d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19d8;
  allocator<char> local_19b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19b8;
  allocator<char> local_199a;
  allocator<char> local_1999;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1998;
  allocator<char> local_197a;
  allocator<char> local_1979;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1978;
  allocator<char> local_1959;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1958;
  allocator<char> local_193a;
  allocator<char> local_1939;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1938;
  allocator<char> local_191a;
  allocator<char> local_1919;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1918;
  allocator<char> local_18f2;
  allocator<char> local_18f1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_18f0;
  allocator<char> local_18d2;
  allocator<char> local_18d1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_18d0;
  allocator<char> local_18b2;
  allocator<char> local_18b1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_18b0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1898;
  allocator_type local_1879;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1878;
  allocator<char> local_1859;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1858;
  allocator<char> local_1831;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1830;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1818;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1800;
  allocator<char> local_17e2;
  allocator<char> local_17e1;
  RPCResults local_17e0;
  allocator_type local_17c1;
  allocator<char> local_17c0;
  bool local_17bf;
  allocator<char> local_17be;
  allocator<char> local_17bd;
  allocator<char> local_17bc;
  allocator<char> local_17bb;
  allocator<char> local_17ba;
  allocator<char> local_17b9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_17b8;
  allocator<char> local_179a;
  allocator<char> local_1799;
  string local_1798;
  string local_1778;
  string local_1758;
  string local_1738;
  string local_1718;
  string local_16f8;
  string local_16d8;
  string local_16b8;
  string local_1698;
  string local_1678;
  string local_1658;
  string local_1638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15d8;
  char *local_15b8;
  size_type local_15b0;
  char local_15a8 [8];
  undefined8 uStack_15a0;
  string local_1598 [32];
  string local_1578 [32];
  RPCResult local_1558;
  string local_14d0 [32];
  string local_14b0 [32];
  string local_1490 [32];
  string local_1470 [32];
  string local_1450 [32];
  string local_1430 [32];
  RPCResult local_1410;
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12e8;
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  string local_1268 [32];
  string local_1248 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  string local_1208 [32];
  string local_11e8 [32];
  string local_11c8 [32];
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [32];
  RPCResult local_1128;
  size_type local_1030;
  RPCResult local_1018;
  RPCResult local_f90;
  RPCResult local_f08;
  RPCResult local_e80;
  RPCResult local_df8;
  RPCResult local_d70;
  RPCResult local_ce8;
  string local_c60 [32];
  string local_c40 [32];
  RPCResult local_c20;
  string local_b98 [32];
  string local_b78 [32];
  RPCResult local_b58 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  string local_8f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  string local_8b8 [32];
  RPCResult local_898 [2];
  string local_788 [32];
  string local_768 [32];
  RPCResult local_748;
  RPCArgOptions local_6c0;
  string local_678 [32];
  UniValue local_658;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_600;
  string local_5a0 [32];
  RPCArgOptions local_580;
  string local_538 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  string local_498 [32];
  RPCArgOptions local_478;
  string local_430 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  string local_3b0 [32];
  RPCArg local_390 [3];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"gettransaction",&local_1799);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"\nGet detailed information about in-wallet transaction <txid>\n",&local_179a)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"txid",&local_17b9);
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_430,"The transaction id",&local_17ba);
  local_478.oneline_description._M_dataplus._M_p = (pointer)&local_478.oneline_description.field_2;
  local_478.skip_type_check = false;
  local_478.oneline_description._M_string_length = 0;
  local_478.oneline_description.field_2._M_local_buf[0] = '\0';
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_478.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_478._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe518;
  name._8_16_ = in_stack_ffffffffffffe520;
  name.field_2._8_8_ = in_stack_ffffffffffffe530;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe540;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe538;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe548;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe550;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe558;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe568;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe570;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe578;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe580;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe588;
  description_18._M_string_length = in_stack_ffffffffffffe5a0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe598;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5a8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe5b0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5c0;
  opts._0_8_ = in_stack_ffffffffffffe5b8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe5c8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5d0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe5d8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe5e0._0_24_;
  opts.hidden = (bool)in_stack_ffffffffffffe5e0[0x18];
  opts.also_positional = (bool)in_stack_ffffffffffffe5e0[0x19];
  opts._66_6_ = in_stack_ffffffffffffe5e0._26_6_;
  RPCArg::RPCArg(local_390,name,(Type)local_3b0,fallback,description_18,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_498,"include_watchonly",&local_17bb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"true for watch-only wallets, otherwise false",&local_17bc);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_4f8,&local_518);
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,
             "Whether to include watch-only addresses in balance calculation and details[]",
             &local_17bd);
  local_580.oneline_description._M_dataplus._M_p = (pointer)&local_580.oneline_description.field_2;
  local_580.skip_type_check = false;
  local_580.oneline_description._M_string_length = 0;
  local_580.oneline_description.field_2._M_local_buf[0] = '\0';
  local_580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_580._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe518;
  name_00._8_16_ = in_stack_ffffffffffffe520;
  name_00.field_2._8_8_ = in_stack_ffffffffffffe530;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe540;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe538;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe548;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe550;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe558;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe568;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe570;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe578;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe580;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe588;
  description_19._M_string_length = in_stack_ffffffffffffe5a0;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe598;
  description_19.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5a8;
  description_19.field_2._8_8_ = in_stack_ffffffffffffe5b0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5c0;
  opts_00._0_8_ = in_stack_ffffffffffffe5b8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe5c8;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5d0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe5d8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe5e0._0_24_;
  opts_00.hidden = (bool)in_stack_ffffffffffffe5e0[0x18];
  opts_00.also_positional = (bool)in_stack_ffffffffffffe5e0[0x19];
  opts_00._66_6_ = in_stack_ffffffffffffe5e0._26_6_;
  RPCArg::RPCArg(local_390 + 1,name_00,(Type)local_498,fallback_00,description_19,opts_00);
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"verbose",&local_17be);
  local_17bf = false;
  UniValue::UniValue<bool,_bool,_true>(&local_658,&local_17bf);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_600,&local_658);
  std::__cxx11::string::string<std::allocator<char>>
            (local_678,
             "Whether to include a `decoded` field containing the decoded transaction (equivalent to RPC decoderawtransaction)"
             ,&local_17c0);
  local_6c0.oneline_description._M_dataplus._M_p = (pointer)&local_6c0.oneline_description.field_2;
  local_6c0.skip_type_check = false;
  local_6c0.oneline_description._M_string_length = 0;
  local_6c0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_6c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_6c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_6c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_6c0._58_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe518;
  name_01._8_16_ = in_stack_ffffffffffffe520;
  name_01.field_2._8_8_ = in_stack_ffffffffffffe530;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe540;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe538;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe548;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe550;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe558;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe568;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe570;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe578;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe580;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe588;
  description_20._M_string_length = in_stack_ffffffffffffe5a0;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe598;
  description_20.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5a8;
  description_20.field_2._8_8_ = in_stack_ffffffffffffe5b0;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5c0;
  opts_01._0_8_ = in_stack_ffffffffffffe5b8;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe5c8;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5d0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe5d8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffe5e0._0_24_;
  opts_01.hidden = (bool)in_stack_ffffffffffffe5e0[0x18];
  opts_01.also_positional = (bool)in_stack_ffffffffffffe5e0[0x19];
  opts_01._66_6_ = in_stack_ffffffffffffe5e0._26_6_;
  RPCArg::RPCArg(local_390 + 2,name_01,(Type)local_5a0,fallback_01,description_20,opts_01);
  __l._M_len = 3;
  __l._M_array = local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_17b8,__l,&local_17c1);
  std::__cxx11::string::string<std::allocator<char>>(local_768,"",&local_17e1);
  std::__cxx11::string::string<std::allocator<char>>(local_788,"",&local_17e2);
  std::__cxx11::string::string<std::allocator<char>>(local_8b8,"amount",&local_1831);
  std::operator+(&local_8d8,"The amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  local_1858.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1858.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1858.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe518;
  m_key_name._8_16_ = in_stack_ffffffffffffe520;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffe530;
  description._M_string_length = in_stack_ffffffffffffe540;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe568;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult(local_898,STR_AMOUNT,m_key_name,description,inner,SUB81(local_8b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_8f8,"fee",&local_1859);
  std::operator+(&local_938,"The amount of the fee in ",&::CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_918,&local_938,
                 ". This is negative and only available for the\n\'send\' category of transactions."
                );
  local_1878.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1878.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1878.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar1._4_16_ = in_stack_ffffffffffffe520;
  auVar1._0_4_ = in_stack_ffffffffffffe51c;
  auVar1._20_8_ = in_stack_ffffffffffffe530;
  auVar1._28_4_ = 0;
  description_00._M_string_length = in_stack_ffffffffffffe540;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            (local_898 + 1,STR_AMOUNT,(string)(auVar1 << 0x20),SUB81(local_8f8,0),description_00,
             inner_00,true);
  __l_00._M_len = 2;
  __l_00._M_array = local_898;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1830,__l_00,&local_1879);
  TransactionDescriptionString();
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = in_stack_ffffffffffffe51c;
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = uVar9;
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe520._0_8_;
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffe520._8_8_;
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>(&local_1818,v1,&local_1830);
  std::__cxx11::string::string<std::allocator<char>>(local_b78,"details",&local_18b1);
  std::__cxx11::string::string<std::allocator<char>>(local_b98,"",&local_18b2);
  std::__cxx11::string::string<std::allocator<char>>(local_c40,"",&local_18d1);
  std::__cxx11::string::string<std::allocator<char>>(local_c60,"",&local_18d2);
  std::__cxx11::string::string<std::allocator<char>>(local_1148,"involvesWatchonly",&local_18f1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1168,"Only returns true if imported addresses were involved in transaction.",
             &local_18f2);
  local_1918.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1918.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1918.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_16_ = in_stack_ffffffffffffe520;
  auVar2._0_4_ = in_stack_ffffffffffffe51c;
  auVar2._20_8_ = in_stack_ffffffffffffe530;
  auVar2._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffe540;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            (&local_1128,BOOL,(string)(auVar2 << 0x20),SUB81(local_1148,0),description_01,inner_01,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1188,"address",&local_1919);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11a8,"The bitcoin address involved in the transaction.",&local_191a);
  local_1938.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1938.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1938.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar3._4_16_ = in_stack_ffffffffffffe520;
  auVar3._0_4_ = in_stack_ffffffffffffe51c;
  auVar3._20_8_ = in_stack_ffffffffffffe530;
  auVar3._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffe540;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)&stack0xffffffffffffef60,STR,(string)(auVar3 << 0x20),SUB81(local_1188,0),
             description_02,inner_02,true);
  std::__cxx11::string::string<std::allocator<char>>(local_11c8,"category",&local_1939);
  std::__cxx11::string::string<std::allocator<char>>
            (local_11e8,
             "The transaction category.\n\"send\"                  Transactions sent.\n\"receive\"               Non-coinbase transactions received.\n\"generate\"              Coinbase transactions received with more than 100 confirmations.\n\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n\"orphan\"                Orphaned coinbase transactions received."
             ,&local_193a);
  local_1958.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1958.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1958.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_00._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_03._M_string_length = in_stack_ffffffffffffe540;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult(&local_1018,STR,m_key_name_00,description_03,inner_03,SUB81(local_11c8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1208,"amount",&local_1959);
  std::operator+(&local_1228,"The amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  local_1978.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1978.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1978.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_01._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_04._M_string_length = in_stack_ffffffffffffe540;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            (&local_f90,STR_AMOUNT,m_key_name_01,description_04,inner_04,SUB81(local_1208,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1248,"label",&local_1979);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1268,"A comment for the address/transaction, if any",&local_197a);
  local_1998.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1998.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1998.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar4._4_16_ = in_stack_ffffffffffffe520;
  auVar4._0_4_ = in_stack_ffffffffffffe51c;
  auVar4._20_8_ = in_stack_ffffffffffffe530;
  auVar4._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffe540;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            (&local_f08,STR,(string)(auVar4 << 0x20),SUB81(local_1248,0),description_05,inner_05,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1288,"vout",&local_1999);
  std::__cxx11::string::string<std::allocator<char>>(local_12a8,"the vout value",&local_199a);
  local_19b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_02._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_06._M_string_length = in_stack_ffffffffffffe540;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult(&local_e80,NUM,m_key_name_02,description_06,inner_06,SUB81(local_1288,0));
  std::__cxx11::string::string<std::allocator<char>>(local_12c8,"fee",&local_19b9);
  std::operator+(&local_1308,"The amount of the fee in ",&::CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_12e8,&local_1308,
                 ". This is negative and only available for the \n\'send\' category of transactions."
                );
  local_19d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar5._4_16_ = in_stack_ffffffffffffe520;
  auVar5._0_4_ = in_stack_ffffffffffffe51c;
  auVar5._20_8_ = in_stack_ffffffffffffe530;
  auVar5._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffe540;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            (&local_df8,STR_AMOUNT,(string)(auVar5 << 0x20),SUB81(local_12c8,0),description_07,
             inner_07,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1328,"abandoned",&local_19d9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1348,"\'true\' if the transaction has been abandoned (inputs are respendable).",
             &local_19da);
  local_19f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_03._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_08._M_string_length = in_stack_ffffffffffffe540;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult(&local_d70,BOOL,m_key_name_03,description_08,inner_08,SUB81(local_1328,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1368,"parent_descs",&local_19f9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1388,
             "Only if \'category\' is \'received\'. List of parent descriptors for the output script of this coin."
             ,&local_19fa);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1430,"desc",(allocator<char> *)&stack0xffffffffffffe5e7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1450,"The descriptor string.",(allocator<char> *)&stack0xffffffffffffe5e6);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_04._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_09._M_string_length = in_stack_ffffffffffffe540;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult(&local_1410,STR,m_key_name_04,description_09,inner_09,SUB81(local_1430,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1410;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe5e8,__l_01,
             (allocator_type *)&stack0xffffffffffffe5c7);
  uVar9 = 0;
  auVar6._4_16_ = in_stack_ffffffffffffe520;
  auVar6._0_4_ = in_stack_ffffffffffffe51c;
  auVar6._20_8_ = in_stack_ffffffffffffe530;
  auVar6._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffe540;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            (&local_ce8,ARR,(string)(auVar6 << 0x20),SUB81(local_1368,0),description_10,inner_10,
             true);
  __l_02._M_len = 9;
  __l_02._M_array = &local_1128;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_18f0,__l_02,(allocator_type *)&stack0xffffffffffffe5c6);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_05._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_11._M_string_length = in_stack_ffffffffffffe540;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult(&local_c20,OBJ,m_key_name_05,description_11,inner_11,SUB81(local_c40,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_c20;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_18d0,__l_03,(allocator_type *)&stack0xffffffffffffe5c5);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_06._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_12._M_string_length = in_stack_ffffffffffffe540;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult(local_b58,ARR,m_key_name_06,description_12,inner_12,SUB81(local_b78,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1470,"hex",(allocator<char> *)&stack0xffffffffffffe5c4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1490,"Raw data for transaction",(allocator<char> *)&stack0xffffffffffffe5c3);
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_07._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_13._M_string_length = in_stack_ffffffffffffe540;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe568;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            (local_b58 + 1,STR_HEX,m_key_name_07,description_13,inner_13,SUB81(local_1470,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_14b0,"decoded",(allocator<char> *)&stack0xffffffffffffe5a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_14d0,"The decoded transaction (only present when `verbose` is passed)",
             (allocator<char> *)&stack0xffffffffffffe5a6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1578,"",(allocator<char> *)&stack0xffffffffffffe587);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1598,
             "Equivalent to the RPC decoderawtransaction method, or the RPC getrawtransaction method when `verbose` is passed."
             ,(allocator<char> *)&stack0xffffffffffffe586);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_08._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_14._M_string_length = in_stack_ffffffffffffe540;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            (&local_1558,ELISION,m_key_name_08,description_14,inner_14,SUB81(local_1578,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_1558;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe588,__l_04,
             (allocator_type *)&stack0xffffffffffffe567);
  uVar9 = 0;
  auVar7._4_16_ = in_stack_ffffffffffffe520;
  auVar7._0_4_ = in_stack_ffffffffffffe51c;
  auVar7._20_8_ = in_stack_ffffffffffffe530;
  auVar7._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffe540;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult
            (local_b58 + 2,OBJ,(string)(auVar7 << 0x20),SUB81(local_14b0,0),description_15,inner_15,
             true);
  RPCResult::RPCResult(local_b58 + 3,(RPCResult *)RESULT_LAST_PROCESSED_BLOCK);
  __l_05._M_len = 4;
  __l_05._M_array = local_b58;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_18b0,__l_05,(allocator_type *)&stack0xffffffffffffe566);
  v1_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = in_stack_ffffffffffffe51c;
  v1_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = uVar9;
  v1_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe520._0_8_;
  v1_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffe520._8_8_;
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>(&local_1800,v1_00,&local_1818);
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe51c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_09._8_16_ = in_stack_ffffffffffffe520;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_16._M_string_length = in_stack_ffffffffffffe540;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe538;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe548;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe550;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe558._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe558._8_8_;
  RPCResult::RPCResult(&local_748,OBJ,m_key_name_09,description_16,inner_16,SUB81(local_768,0));
  result._4_4_ = in_stack_ffffffffffffe51c;
  result.m_type = uVar9;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe520._0_8_;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe520._8_8_;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe530;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe538;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe540;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe548;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe550;
  result.m_optional = (bool)in_stack_ffffffffffffe558[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffe558[1];
  result._66_6_ = in_stack_ffffffffffffe558._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe558._8_8_;
  result.m_description._M_string_length = (size_type)pRVar10;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar11;
  result.m_description.field_2._8_8_ = pRVar12;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe580;
  result.m_cond._8_16_ = in_stack_ffffffffffffe588;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffe598;
  RPCResults::RPCResults(&local_17e0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1658,"gettransaction",(allocator<char> *)&stack0xffffffffffffe565);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1678,
             "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"",
             (allocator<char> *)&stack0xffffffffffffe564);
  HelpExampleCli(&local_1638,&local_1658,&local_1678);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16b8,"gettransaction",(allocator<char> *)&stack0xffffffffffffe563);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16d8,
             "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" true",
             (allocator<char> *)&stack0xffffffffffffe562);
  HelpExampleCli(&local_1698,&local_16b8,&local_16d8);
  std::operator+(&local_1618,&local_1638,&local_1698);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1718,"gettransaction",(allocator<char> *)&stack0xffffffffffffe561);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1738,
             "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" false true",
             (allocator<char> *)&stack0xffffffffffffe560);
  HelpExampleCli(&local_16f8,&local_1718,&local_1738);
  std::operator+(&local_15f8,&local_1618,&local_16f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1778,"gettransaction",(allocator<char> *)&stack0xffffffffffffe55f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1798,
             "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"",
             (allocator<char> *)&stack0xffffffffffffe55e);
  HelpExampleRpc(&local_1758,&local_1778,&local_1798);
  std::operator+(&local_15d8,&local_15f8,&local_1758);
  local_15b8 = local_15a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15d8._M_dataplus._M_p == &local_15d8.field_2) {
    uStack_15a0 = local_15d8.field_2._8_8_;
  }
  else {
    local_15b8 = local_15d8._M_dataplus._M_p;
  }
  local_15b0 = local_15d8._M_string_length;
  local_15d8._M_string_length = 0;
  local_15d8.field_2._M_local_buf[0] = '\0';
  name_02._8_16_ = in_stack_ffffffffffffe520;
  name_02._M_dataplus._M_p = &stack0xffffffffffffe538;
  name_02.field_2._8_8_ = in_stack_ffffffffffffe530;
  description_17.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:751:9)>
       ::_M_manager;
  description_17._M_dataplus._M_p = (pointer)0x0;
  description_17._M_string_length = 0;
  description_17.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:751:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar10;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe558._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe558._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe580;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe598;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe588._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  fun.super__Function_base._M_functor._8_8_ = pRVar14;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar13;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar15;
  fun._M_invoker = in_stack_ffffffffffffe5c0;
  local_15d8._M_dataplus._M_p = (pointer)&local_15d8.field_2;
  RPCHelpMan::RPCHelpMan(in_RDI,name_02,description_17,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe538);
  std::__cxx11::string::~string((string *)&local_15b8);
  std::__cxx11::string::~string((string *)&local_15d8);
  std::__cxx11::string::~string((string *)&local_1758);
  std::__cxx11::string::~string((string *)&local_1798);
  std::__cxx11::string::~string((string *)&local_1778);
  std::__cxx11::string::~string((string *)&local_15f8);
  std::__cxx11::string::~string((string *)&local_16f8);
  std::__cxx11::string::~string((string *)&local_1738);
  std::__cxx11::string::~string((string *)&local_1718);
  std::__cxx11::string::~string((string *)&local_1618);
  std::__cxx11::string::~string((string *)&local_1698);
  std::__cxx11::string::~string((string *)&local_16d8);
  std::__cxx11::string::~string((string *)&local_16b8);
  std::__cxx11::string::~string((string *)&local_1638);
  std::__cxx11::string::~string((string *)&local_1678);
  std::__cxx11::string::~string((string *)&local_1658);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_17e0.m_results);
  RPCResult::~RPCResult(&local_748);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1800);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_18b0);
  lVar8 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_b58[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe588);
  RPCResult::~RPCResult(&local_1558);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe568);
  std::__cxx11::string::~string(local_1598);
  std::__cxx11::string::~string(local_1578);
  std::__cxx11::string::~string(local_14d0);
  std::__cxx11::string::~string(local_14b0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe5a8);
  std::__cxx11::string::~string(local_1490);
  std::__cxx11::string::~string(local_1470);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_18d0);
  RPCResult::~RPCResult(&local_c20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_18f0);
  lVar8 = 0x440;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1128.m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe5e8);
  RPCResult::~RPCResult(&local_1410);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe5c8);
  std::__cxx11::string::~string(local_1450);
  std::__cxx11::string::~string(local_1430);
  std::__cxx11::string::~string(local_1388);
  std::__cxx11::string::~string(local_1368);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19f8);
  std::__cxx11::string::~string(local_1348);
  std::__cxx11::string::~string(local_1328);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19d8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::~string((string *)&local_1308);
  std::__cxx11::string::~string(local_12c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19b8);
  std::__cxx11::string::~string(local_12a8);
  std::__cxx11::string::~string(local_1288);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1998);
  std::__cxx11::string::~string(local_1268);
  std::__cxx11::string::~string(local_1248);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1978);
  std::__cxx11::string::~string((string *)&local_1228);
  std::__cxx11::string::~string(local_1208);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1958);
  std::__cxx11::string::~string(local_11e8);
  std::__cxx11::string::~string(local_11c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1938);
  std::__cxx11::string::~string(local_11a8);
  std::__cxx11::string::~string(local_1188);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1918);
  std::__cxx11::string::~string(local_1168);
  std::__cxx11::string::~string(local_1148);
  std::__cxx11::string::~string(local_c60);
  std::__cxx11::string::~string(local_c40);
  std::__cxx11::string::~string(local_b98);
  std::__cxx11::string::~string(local_b78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1818);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1898);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1830);
  lVar8 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_898[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1878);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string(local_8f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1858);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string(local_8b8);
  std::__cxx11::string::~string(local_788);
  std::__cxx11::string::~string(local_768);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_17b8);
  lVar8 = 0x210;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_390[0].m_names._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_6c0);
  std::__cxx11::string::~string(local_678);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_600);
  UniValue::~UniValue(&local_658);
  std::__cxx11::string::~string(local_5a0);
  RPCArgOptions::~RPCArgOptions(&local_580);
  std::__cxx11::string::~string(local_538);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_4f8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string(local_498);
  RPCArgOptions::~RPCArgOptions(&local_478);
  std::__cxx11::string::~string(local_430);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan gettransaction()
{
    return RPCHelpMan{"gettransaction",
                "\nGet detailed information about in-wallet transaction <txid>\n",
                {
                    {"txid", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction id"},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"},
                            "Whether to include watch-only addresses in balance calculation and details[]"},
                    {"verbose", RPCArg::Type::BOOL, RPCArg::Default{false},
                            "Whether to include a `decoded` field containing the decoded transaction (equivalent to RPC decoderawtransaction)"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "", Cat(Cat<std::vector<RPCResult>>(
                    {
                        {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT},
                        {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the\n"
                                     "'send' category of transactions."},
                    },
                    TransactionDescriptionString()),
                    {
                        {RPCResult::Type::ARR, "details", "",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction."},
                                {RPCResult::Type::STR, "address", /*optional=*/true, "The bitcoin address involved in the transaction."},
                                {RPCResult::Type::STR, "category", "The transaction category.\n"
                                    "\"send\"                  Transactions sent.\n"
                                    "\"receive\"               Non-coinbase transactions received.\n"
                                    "\"generate\"              Coinbase transactions received with more than 100 confirmations.\n"
                                    "\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n"
                                    "\"orphan\"                Orphaned coinbase transactions received."},
                                {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT},
                                {RPCResult::Type::STR, "label", /*optional=*/true, "A comment for the address/transaction, if any"},
                                {RPCResult::Type::NUM, "vout", "the vout value"},
                                {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the \n"
                                    "'send' category of transactions."},
                                {RPCResult::Type::BOOL, "abandoned", "'true' if the transaction has been abandoned (inputs are respendable)."},
                                {RPCResult::Type::ARR, "parent_descs", /*optional=*/true, "Only if 'category' is 'received'. List of parent descriptors for the output script of this coin.", {
                                    {RPCResult::Type::STR, "desc", "The descriptor string."},
                                }},
                            }},
                        }},
                        {RPCResult::Type::STR_HEX, "hex", "Raw data for transaction"},
                        {RPCResult::Type::OBJ, "decoded", /*optional=*/true, "The decoded transaction (only present when `verbose` is passed)",
                        {
                            {RPCResult::Type::ELISION, "", "Equivalent to the RPC decoderawtransaction method, or the RPC getrawtransaction method when `verbose` is passed."},
                        }},
                        RESULT_LAST_PROCESSED_BLOCK,
                    })
                },
                RPCExamples{
                    HelpExampleCli("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"")
            + HelpExampleCli("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" true")
            + HelpExampleCli("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" false true")
            + HelpExampleRpc("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    uint256 hash(ParseHashV(request.params[0], "txid"));

    isminefilter filter = ISMINE_SPENDABLE;

    if (ParseIncludeWatchonly(request.params[1], *pwallet)) {
        filter |= ISMINE_WATCH_ONLY;
    }

    bool verbose = request.params[2].isNull() ? false : request.params[2].get_bool();

    UniValue entry(UniValue::VOBJ);
    auto it = pwallet->mapWallet.find(hash);
    if (it == pwallet->mapWallet.end()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid or non-wallet transaction id");
    }
    const CWalletTx& wtx = it->second;

    CAmount nCredit = CachedTxGetCredit(*pwallet, wtx, filter);
    CAmount nDebit = CachedTxGetDebit(*pwallet, wtx, filter);
    CAmount nNet = nCredit - nDebit;
    CAmount nFee = (CachedTxIsFromMe(*pwallet, wtx, filter) ? wtx.tx->GetValueOut() - nDebit : 0);

    entry.pushKV("amount", ValueFromAmount(nNet - nFee));
    if (CachedTxIsFromMe(*pwallet, wtx, filter))
        entry.pushKV("fee", ValueFromAmount(nFee));

    WalletTxToJSON(*pwallet, wtx, entry);

    UniValue details(UniValue::VARR);
    ListTransactions(*pwallet, wtx, 0, false, details, filter, /*filter_label=*/std::nullopt);
    entry.pushKV("details", std::move(details));

    entry.pushKV("hex", EncodeHexTx(*wtx.tx));

    if (verbose) {
        UniValue decoded(UniValue::VOBJ);
        TxToUniv(*wtx.tx, /*block_hash=*/uint256(), /*entry=*/decoded, /*include_hex=*/false);
        entry.pushKV("decoded", std::move(decoded));
    }

    AppendLastProcessedBlock(entry, *pwallet);
    return entry;
},
    };
}